

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall Scene::update(Scene *this,ResourcePack *resource_pack)

{
  vector<float,_std::allocator<float>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  int iVar1;
  pointer pfVar2;
  pointer puVar3;
  GLenum GVar4;
  ostream *poVar5;
  Mesh *pMVar6;
  int iVar7;
  int iVar8;
  allocator local_69;
  int local_68;
  int local_64;
  string box_mesh;
  
  this_00 = &this->grid_vertices;
  std::vector<float,_std::allocator<float>_>::reserve
            (this_00,((long)this->grid_width + 1) * ((long)this->grid_height + 1));
  this_01 = &this->grid_indices;
  iVar1 = 0;
  while (iVar7 = iVar1, iVar7 <= this->grid_height) {
    local_68 = iVar7 + 1;
    iVar8 = 0;
    while (iVar1 = local_68, iVar8 <= this->grid_width) {
      box_mesh._M_dataplus._M_p._0_4_ = (float)(this->grid_cell_size * iVar8 + this->grid_start_x);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(this_00,(float *)&box_mesh);
      box_mesh._M_dataplus._M_p._0_4_ = -1.0;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(this_00,(float *)&box_mesh);
      box_mesh._M_dataplus._M_p._0_4_ = (float)(this->grid_cell_size * iVar7 + this->grid_start_y);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(this_00,(float *)&box_mesh);
      iVar1 = this->grid_height;
      if (iVar7 < iVar1 && iVar8 < iVar1) {
        box_mesh._M_dataplus._M_p._0_4_ = (float)((iVar1 + 1) * iVar7 + iVar8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_01,(uint *)&box_mesh);
        local_64 = iVar8 + 1;
        box_mesh._M_dataplus._M_p._0_4_ = (float)((this->grid_height + 1) * iVar7 + iVar8 + 1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_01,(uint *)&box_mesh);
        iVar1 = local_68;
        box_mesh._M_dataplus._M_p._0_4_ = (float)((this->grid_height + 1) * local_68 + iVar8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_01,(uint *)&box_mesh);
        box_mesh._M_dataplus._M_p._0_4_ = (float)((this->grid_height + 1) * iVar7 + iVar8 + 1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_01,(uint *)&box_mesh);
        box_mesh._M_dataplus._M_p._0_4_ = (float)((this->grid_height + 1) * iVar1 + iVar8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_01,(uint *)&box_mesh);
        box_mesh._M_dataplus._M_p._0_4_ = (float)((this->grid_height + 1) * iVar1 + iVar8 + 1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_01,(uint *)&box_mesh);
        iVar8 = local_64;
      }
      else {
        iVar8 = iVar8 + 1;
      }
    }
  }
  (*__glewGenBuffers)(1,&this->grid_vertex_buffer);
  (*__glewBindBuffer)(0x8892,this->grid_vertex_buffer);
  pfVar2 = (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*__glewBufferData)(0x8892,(long)(this->grid_vertices).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar2,pfVar2,0x88e4);
  (*__glewGenBuffers)(1,&this->grid_index_buffer);
  (*__glewBindBuffer)(0x8893,this->grid_index_buffer);
  puVar3 = (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (*__glewBufferData)(0x8893,(long)(this->grid_indices).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar3,puVar3,
                      0x88e4);
  (*__glewGenFramebuffers)(1,&this->depth_map_framebuffer);
  glGenTextures(1,&this->depth_map);
  glBindTexture(0xde1,this->depth_map);
  glTexImage2D(0xde1,0,0x1902,this->shadow_width,this->shadow_height,0,0x1902,0x1406,0);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2600);
  glTexParameteri(0xde1,0x2802,0x2901);
  glTexParameteri(0xde1,0x2803,0x2901);
  (*__glewBindFramebuffer)(0x8d40,this->depth_map_framebuffer);
  (*__glewFramebufferTexture2D)(0x8d40,0x8d00,0xde1,this->depth_map,0);
  glDrawBuffer(0);
  glReadBuffer(0);
  GVar4 = (*__glewCheckFramebufferStatus)(0x8d40);
  if (GVar4 != 0x8cd5) {
    poVar5 = std::operator<<((ostream *)&std::cout,"error creating texture");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  (*__glewBindFramebuffer)(0x8d40,0);
  std::__cxx11::string::string((string *)&box_mesh,"box",&local_69);
  pMVar6 = ResourcePack::get_mesh(resource_pack,&box_mesh);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar5);
  (*__glewGenBuffers)(1,&this->object_vertex_buffer);
  (*__glewBindBuffer)(0x8892,this->object_vertex_buffer);
  pfVar2 = (pMVar6->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*__glewBufferData)(0x8892,(long)(pMVar6->vertices).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar2,pfVar2,0x88e4);
  (*__glewGenBuffers)(1,&this->object_normal_buffer);
  (*__glewBindBuffer)(0x8892,this->object_normal_buffer);
  pfVar2 = (pMVar6->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*__glewBufferData)(0x8892,(long)(pMVar6->normals).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar2,pfVar2,0x88e4);
  std::__cxx11::string::~string((string *)&box_mesh);
  return;
}

Assistant:

void Scene::update(ResourcePack& resource_pack) {
    grid_vertices.reserve((grid_height+1)*(grid_width+1));
    for(int i=0; i < grid_height+1; ++i) {
        for(int j=0; j < grid_width+1; ++j) {
            grid_vertices.push_back(grid_start_x+grid_cell_size*j);
            grid_vertices.push_back(-1.0);
            grid_vertices.push_back(grid_start_y+grid_cell_size*i);
            if ((i<grid_height) && (j<grid_height)) {
                grid_indices.push_back(i*(grid_height+1)+j);
                grid_indices.push_back(i*(grid_height+1)+j+1);
                grid_indices.push_back((i+1)*(grid_height+1)+j);
                grid_indices.push_back(i*(grid_height+1)+j+1);
                grid_indices.push_back((i+1)*(grid_height+1)+j);
                grid_indices.push_back((i+1)*(grid_height+1)+j+1);
            }
        }
    }
    glGenBuffers(1, &grid_vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, grid_vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(grid_vertices[0]) * grid_vertices.size(), grid_vertices.data(), GL_STATIC_DRAW);
    glGenBuffers(1, &grid_index_buffer);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, grid_index_buffer);
    glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(grid_indices[0])*grid_indices.size(), grid_indices.data(), GL_STATIC_DRAW);

    glGenFramebuffers(1, &depth_map_framebuffer);

    glGenTextures(1, &depth_map);
    glBindTexture(GL_TEXTURE_2D, depth_map);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_DEPTH_COMPONENT, shadow_width, shadow_height, 0, GL_DEPTH_COMPONENT, GL_FLOAT, NULL);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);

    glBindFramebuffer(GL_FRAMEBUFFER, depth_map_framebuffer);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, depth_map, 0);
    glDrawBuffer(GL_NONE);
    glReadBuffer(GL_NONE);
    if(glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
        std::cout << "error creating texture" << std::endl;
    }
    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    std::string box_mesh("box");
        Mesh * objmesh = resource_pack.get_mesh(box_mesh);

    std::cout << objmesh->normals.size() << std::endl;

    glGenBuffers(1, &object_vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, object_vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(float) * objmesh->vertices.size(), objmesh->vertices.data(), GL_STATIC_DRAW);

    glGenBuffers(1, &object_normal_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, object_normal_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(float) * objmesh->normals.size(), objmesh->normals.data(), GL_STATIC_DRAW);
}